

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O3

string * Soundex::encodeString(string *__return_storage_ptr__,string *word)

{
  int iVar1;
  Soundex *pSVar2;
  char *c_00;
  char *c_01;
  Soundex SVar3;
  ulong uVar4;
  vector<char,_std::allocator<char>_> *__range1;
  char c;
  string nextEncoding;
  string prevEncoding;
  Soundex local_79;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  toupper((int)*(word->_M_dataplus)._M_p);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  encodeChar_abi_cxx11_(&local_50,(Soundex *)(__return_storage_ptr__->_M_dataplus)._M_p,c_00);
  if (1 < word->_M_string_length) {
    uVar4 = 1;
    SVar3 = (Soundex)0x0;
    do {
      iVar1 = toupper((int)(word->_M_dataplus)._M_p[uVar4]);
      local_79 = SUB41(iVar1,0);
      encodeChar_abi_cxx11_(&local_78,&local_79,c_01);
      iVar1 = std::__cxx11::string::compare((char *)&local_78);
      pSVar2 = (Soundex *)
               VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 != 0) {
        for (; pSVar2 != (Soundex *)
                         VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
          if (SVar3 == *pSVar2) goto LAB_001035c7;
        }
        if ((local_78._M_string_length != local_50._M_string_length) ||
           ((local_78._M_string_length != 0 &&
            (iVar1 = bcmp(local_78._M_dataplus._M_p,local_50._M_dataplus._M_p,
                          local_78._M_string_length), iVar1 != 0)))) {
LAB_001035c7:
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
          std::__cxx11::string::_M_assign((string *)&local_50);
        }
      }
      SVar3 = local_79;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < word->_M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Soundex::encodeString(const string &word) {
    string encoded = string(1, toupper(word[0]));
    char prevChar = 0;
    string prevEncoding = encodeChar(encoded[0]);
    for (int i = 1; i < word.length(); i++) {
        char c = toupper(word[i]);
        string nextEncoding = encodeChar(c);
        if (nextEncoding != "" && (isVowel(prevChar) || nextEncoding != prevEncoding)) {
            encoded += nextEncoding;
            prevEncoding = nextEncoding;
        }
        prevChar = c;
    }
    return encoded;
}